

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

void itemHelp(FILE *fp,poptItem items,wchar_t nitems,columns_t columns,char *translation_domain)

{
  poptOption *opt;
  
  if (L'\0' < nitems && items != (poptItem)0x0) {
    do {
      if ((((items->option).longName != (char *)0x0) || ((items->option).shortName != '\0')) &&
         (((items->option).argInfo & 0x40000000) == 0)) {
        singleOptionHelp(fp,(columns_t)columns->cur,(poptOption *)columns->max,(char *)items);
      }
      items = items + 1;
      nitems = nitems + L'\xffffffff';
    } while (nitems != L'\0');
  }
  return;
}

Assistant:

static void itemHelp(FILE * fp,
		poptItem items, int nitems,
		columns_t columns,
		const char * translation_domain)
{
    poptItem item;
    int i;

    if (items != NULL)
    for (i = 0, item = items; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN))
	    singleOptionHelp(fp, columns, opt, translation_domain);
    }
}